

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O0

void __thiscall rw::ColorQuant::Node::destroy(Node *this)

{
  char *in_RSI;
  int local_14;
  int i;
  Node *this_local;
  
  for (local_14 = 0; local_14 < 0x10; local_14 = local_14 + 1) {
    if (this->children[local_14] != (Node *)0x0) {
      destroy(this->children[local_14]);
    }
  }
  if ((this->link).next != (LLLink *)0x0) {
    LLLink::remove(&this->link,in_RSI);
  }
  (*DAT_001660a8)(this);
  return;
}

Assistant:

void
ColorQuant::Node::destroy(void)
{
	int i;
	for(i = 0; i < 16; i++)
		if(this->children[i])
			this->children[i]->destroy();
	if(this->link.next)
		this->link.remove();
	rwFree(this);
}